

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadCommand.h
# Opt level: O0

cmCommand * __thiscall cmCTestUploadCommand::Clone(cmCTestUploadCommand *this)

{
  cmCTestUploadCommand *this_00;
  cmCTestUploadCommand *ni;
  cmCTestUploadCommand *this_local;
  
  this_00 = (cmCTestUploadCommand *)operator_new(0xd8);
  cmCTestUploadCommand(this_00);
  (this_00->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest =
       (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  (this_00->super_cmCTestHandlerCommand).super_cmCTestCommand.CTestScriptHandler =
       (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTestScriptHandler;
  return (cmCommand *)this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE
  {
    cmCTestUploadCommand* ni = new cmCTestUploadCommand;
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return ni;
  }